

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_readdir(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  char *__name;
  ulong uVar1;
  DIR *__dirp;
  int *piVar2;
  dirent *pdVar3;
  ulong uVar4;
  int64_t iVar5;
  int err;
  uint32_t idx;
  JSValue JVar6;
  JSValue val;
  
  __name = JS_ToCString(ctx,*argv);
  iVar5 = 6;
  if (__name != (char *)0x0) {
    JVar6 = JS_NewArray(ctx);
    if ((int)JVar6.tag != 6) {
      __dirp = opendir(__name);
      err = 0;
      if (__dirp == (DIR *)0x0) {
        piVar2 = __errno_location();
        err = *piVar2;
      }
      JS_FreeCString(ctx,__name);
      if (__dirp != (DIR *)0x0) {
        piVar2 = __errno_location();
        idx = 0;
        while( true ) {
          *piVar2 = 0;
          pdVar3 = readdir(__dirp);
          if (pdVar3 == (dirent *)0x0) break;
          val = JS_NewString(ctx,pdVar3->d_name);
          JS_DefinePropertyValueUint32(ctx,JVar6,idx,val,7);
          idx = idx + 1;
        }
        err = *piVar2;
        closedir(__dirp);
      }
      JVar6 = make_obj_error(ctx,JVar6,err);
      iVar5 = JVar6.tag;
      uVar4 = (ulong)JVar6.u.ptr & 0xffffffff00000000;
      uVar1 = (ulong)JVar6.u._0_4_;
      goto LAB_00110fd3;
    }
    JS_FreeCString(ctx,__name);
  }
  uVar1 = 0;
  uVar4 = 0;
LAB_00110fd3:
  JVar6.u.ptr = (void *)(uVar1 | uVar4);
  JVar6.tag = iVar5;
  return JVar6;
}

Assistant:

static JSValue js_os_readdir(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    const char *path;
    DIR *f;
    struct dirent *d;
    JSValue obj;
    int err;
    uint32_t len;
    
    path = JS_ToCString(ctx, argv[0]);
    if (!path)
        return JS_EXCEPTION;
    obj = JS_NewArray(ctx);
    if (JS_IsException(obj)) {
        JS_FreeCString(ctx, path);
        return JS_EXCEPTION;
    }
    f = opendir(path);
    if (!f)
        err = errno;
    else
        err = 0;
    JS_FreeCString(ctx, path);
    if (!f)
        goto done;
    len = 0;
    for(;;) {
        errno = 0;
        d = readdir(f);
        if (!d) {
            err = errno;
            break;
        }
        JS_DefinePropertyValueUint32(ctx, obj, len++,
                                     JS_NewString(ctx, d->d_name),
                                     JS_PROP_C_W_E);
    }
    closedir(f);
 done:
    return make_obj_error(ctx, obj, err);
}